

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void MetricsHelpMarker(char *desc)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  
  ImGui::TextDisabled("(?)");
  bVar4 = ImGui::IsItemHovered(0x1000);
  if (bVar4) {
    ImGui::BeginTooltipEx(0,0);
    ImGui::PushTextWrapPos(GImGui->FontSize * 35.0);
    ImGui::TextUnformatted(desc,(char *)0x0);
    pIVar3 = GImGui;
    GImGui->CurrentWindow->WriteAccessed = true;
    pIVar2 = pIVar3->CurrentWindow;
    iVar1 = (pIVar2->DC).TextWrapPosStack.Size;
    (pIVar2->DC).TextWrapPos = (pIVar2->DC).TextWrapPosStack.Data[(long)iVar1 + -1];
    (pIVar2->DC).TextWrapPosStack.Size = iVar1 + -1;
    ImGui::End();
    return;
  }
  return;
}

Assistant:

static void MetricsHelpMarker(const char* desc)
{
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered(ImGuiHoveredFlags_DelayShort))
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 35.0f);
        ImGui::TextUnformatted(desc);
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}